

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::StringMakerBase<true>::convert<std::__cxx11::string>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostream *stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stream_00;
  
  stream_00 = in_RDI;
  tlssPush();
  filloss<std::__cxx11::string>((ostream *)stream_00,in_RDI);
  tlssPop();
  return (String *)stream_00;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
                /* When parameter "in" is a null terminated const char* it works.
                 * When parameter "in" is a T arr[N] without '\0' we can fill the
                 * stringstream with N objects (T=char).If in is char pointer *
                 * without '\0' , it would cause segfault
                 * stepping over unaccessible memory.
                 */

                std::ostream* stream = tlssPush();
                filloss(stream, in);
                return tlssPop();
            }